

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O1

QPoint __thiscall
QListModeViewBase::initStaticLayout(QListModeViewBase *this,QListViewLayoutInfo *info)

{
  QList<int> *this_00;
  QList<int> *this_01;
  uint uVar1;
  uint uVar2;
  long in_FS_OFFSET;
  uint local_3c;
  long local_38;
  ulong uVar3;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (info->first == 0) {
    QList<int>::clear(&this->flowPositions);
    this_00 = &this->segmentPositions;
    QList<int>::clear(this_00);
    this_01 = &this->segmentStartRows;
    QList<int>::clear(this_01);
    QList<int>::clear(&this->segmentExtents);
    QList<int>::clear(&this->scrollValueMap);
    uVar1 = (info->bounds).x1.m_i + info->spacing;
    uVar2 = info->spacing + (info->bounds).y1.m_i;
    uVar3 = (ulong)uVar2;
    local_3c = uVar1;
    if (info->flow == LeftToRight) {
      local_3c = uVar2;
    }
    QtPrivate::QPodArrayOps<int>::emplace<int&>
              ((QPodArrayOps<int> *)this_00,(this->segmentPositions).d.size,(int *)&local_3c);
    QList<int>::end(this_00);
    local_3c = 0;
    QtPrivate::QPodArrayOps<int>::emplace<int&>
              ((QPodArrayOps<int> *)this_01,(this->segmentStartRows).d.size,(int *)&local_3c);
    QList<int>::end(this_01);
  }
  else {
    if (info->wrap == true) {
      if (info->flow == LeftToRight) {
        uVar1 = this->batchSavedPosition;
        uVar3 = (ulong)(uint)(this->segmentPositions).d.ptr[(this->segmentPositions).d.size + -1];
        goto LAB_0057cdbd;
      }
      uVar1 = (this->segmentPositions).d.ptr[(this->segmentPositions).d.size + -1];
    }
    else {
      if (info->flow == LeftToRight) {
        uVar1 = this->batchSavedPosition;
        uVar3 = (ulong)(uint)(info->spacing + (info->bounds).y1.m_i);
        goto LAB_0057cdbd;
      }
      uVar1 = info->spacing + (info->bounds).x1.m_i;
    }
    uVar3 = (ulong)(uint)this->batchSavedPosition;
  }
LAB_0057cdbd:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QPoint)((ulong)uVar1 | uVar3 << 0x20);
  }
  __stack_chk_fail();
}

Assistant:

QPoint QListModeViewBase::initStaticLayout(const QListViewLayoutInfo &info)
{
    int x, y;
    if (info.first == 0) {
        flowPositions.clear();
        segmentPositions.clear();
        segmentStartRows.clear();
        segmentExtents.clear();
        scrollValueMap.clear();
        x = info.bounds.left() + info.spacing;
        y = info.bounds.top() + info.spacing;
        segmentPositions.append(info.flow == QListView::LeftToRight ? y : x);
        segmentStartRows.append(0);
    } else if (info.wrap) {
        if (info.flow == QListView::LeftToRight) {
            x = batchSavedPosition;
            y = segmentPositions.constLast();
        } else { // flow == QListView::TopToBottom
            x = segmentPositions.constLast();
            y = batchSavedPosition;
        }
    } else { // not first and not wrap
        if (info.flow == QListView::LeftToRight) {
            x = batchSavedPosition;
            y = info.bounds.top() + info.spacing;
        } else { // flow == QListView::TopToBottom
            x = info.bounds.left() + info.spacing;
            y = batchSavedPosition;
        }
    }
    return QPoint(x, y);
}